

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::optimizeSetIfWithBrArm(wasm
::Expression___(void *this,Expression **currp)

{
  bool bVar1;
  bool local_59;
  undefined1 local_50 [8];
  anon_class_32_4_f7c106fa tryToOptimize;
  If *iff;
  LocalSet *set;
  Expression **currp_local;
  FinalOptimizer *this_local;
  
  set = (LocalSet *)currp;
  currp_local = (Expression **)this;
  iff = (If *)Expression::cast<wasm::LocalSet>(*currp);
  tryToOptimize.currp = (Expression ***)Expression::dynCast<wasm::If>(iff->ifTrue);
  if ((((If *)tryToOptimize.currp == (If *)0x0) ||
      (bVar1 = wasm::Type::isConcrete
                         (&(((If *)tryToOptimize.currp)->
                           super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type)
      , !bVar1)) || (bVar1 = wasm::Type::isConcrete((Type *)(tryToOptimize.currp[2] + 1)), !bVar1))
  {
    this_local._7_1_ = false;
  }
  else {
    tryToOptimize.this = (FinalOptimizer *)&tryToOptimize.currp;
    tryToOptimize.iff = &iff;
    tryToOptimize.set = &set;
    local_50 = (undefined1  [8])this;
    bVar1 = RemoveUnusedBrs::doWalkFunction::FinalOptimizer::optimizeSetIfWithBrArm::
            anon_class_32_4_f7c106fa::operator()
                      ((anon_class_32_4_f7c106fa *)local_50,(Expression *)tryToOptimize.currp[3],
                       (Expression *)tryToOptimize.currp[4],false);
    local_59 = true;
    if (!bVar1) {
      local_59 = RemoveUnusedBrs::doWalkFunction::FinalOptimizer::optimizeSetIfWithBrArm::
                 anon_class_32_4_f7c106fa::operator()
                           ((anon_class_32_4_f7c106fa *)local_50,
                            (Expression *)tryToOptimize.currp[4],
                            (Expression *)tryToOptimize.currp[3],true);
    }
    this_local._7_1_ = local_59;
  }
  return this_local._7_1_;
}

Assistant:

bool optimizeSetIfWithBrArm(Expression** currp) {
        auto* set = (*currp)->cast<LocalSet>();
        auto* iff = set->value->dynCast<If>();
        if (!iff || !iff->type.isConcrete() ||
            !iff->condition->type.isConcrete()) {
          return false;
        }
        auto tryToOptimize =
          [&](Expression* one, Expression* two, bool flipCondition) {
            if (one->type == Type::unreachable &&
                two->type != Type::unreachable) {
              if (auto* br = one->dynCast<Break>()) {
                if (ExpressionAnalyzer::isSimple(br)) {
                  // Wonderful, do it!
                  Builder builder(*getModule());
                  if (flipCondition) {
                    builder.flip(iff);
                  }
                  br->condition = iff->condition;
                  br->finalize();
                  set->value = two;
                  auto* block = builder.makeSequence(br, set);
                  *currp = block;
                  // Recurse on the set, which now has a new value.
                  optimizeSetIf(&block->list[1]);
                  return true;
                }
              }
            }
            return false;
          };
        return tryToOptimize(iff->ifTrue, iff->ifFalse, false) ||
               tryToOptimize(iff->ifFalse, iff->ifTrue, true);
      }